

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,4,2>,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,2,4>,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *fmt;
  undefined8 *puVar1;
  bool *pbVar2;
  ostringstream *poVar3;
  _Rb_tree_node_base *p_Var4;
  pointer pMVar5;
  pointer pMVar6;
  Variable<tcu::Matrix<float,_4,_2>_> *pVVar7;
  pointer pcVar8;
  Variable<tcu::Matrix<float,_2,_4>_> *pVVar9;
  double dVar10;
  undefined8 uVar11;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar12;
  PrecisionCase *pPVar13;
  ContextType type;
  int iVar14;
  _Rb_tree_node_base *p_Var15;
  char *pcVar16;
  size_t sVar17;
  long *plVar18;
  ShaderExecutor *pSVar19;
  Interval *pIVar20;
  IVal *pIVar21;
  MessageBuilder *pMVar22;
  TestError *this_00;
  uint uVar23;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar24;
  undefined1 *puVar25;
  Matrix<float,_4,_2> *val;
  long lVar26;
  long lVar27;
  ulong uVar28;
  bool bVar29;
  IVal reference1;
  IVal in2;
  IVal in3;
  Environment env;
  ostringstream os;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  FloatFormat highpFmt;
  ShaderSpec spec;
  FuncSet funcs;
  ostringstream oss;
  undefined1 auStack_578 [15];
  IVal local_569;
  IVal *local_568;
  string local_560;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_540;
  size_t local_538;
  Statement *local_530;
  PrecisionCase *local_528;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<tcu::Matrix<float,_4,_2>,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_520;
  string local_518;
  ulong local_4f8;
  ResultCollector *local_4f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_4e8;
  undefined1 local_4b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4a8;
  double local_498;
  Data local_490;
  undefined4 local_480;
  ios_base local_448 [8];
  ios_base local_440 [264];
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_338;
  FloatFormat local_308;
  undefined1 local_2e0 [56];
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_278;
  undefined1 local_268 [16];
  undefined1 local_258 [24];
  double local_240;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pMVar5 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pMVar6 = (inputs->in0).
           super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_538 = (long)pMVar6 - (long)pMVar5 >> 5;
  local_540 = variables;
  local_530 = stmt;
  local_520 = inputs;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<tcu::Matrix<float,_2,_4>,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_338,local_538);
  local_2a8._M_p = (pointer)&local_298;
  local_2e0._0_4_ = GLSL_VERSION_300_ES;
  local_2e0._8_8_ = (pointer)0x0;
  local_2e0._16_8_ = (pointer)0x0;
  local_2e0._24_8_ = (pointer)0x0;
  local_2e0._32_8_ = (pointer)0x0;
  local_2e0._40_8_ = (pointer)0x0;
  local_2e0._48_8_ = (pointer)0x0;
  local_2a0 = 0;
  local_298._M_local_buf[0] = '\0';
  local_288._M_p = (pointer)&local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = '\0';
  local_308.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_308.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_308.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_308.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_308.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_308.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_308.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_308.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_308._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_4e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_4e8._M_impl.super__Rb_tree_header._M_header;
  local_4e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_4e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_4e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_4b8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  poVar3 = (ostringstream *)(local_4b8 + 8);
  local_4e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_4e8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream(poVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"Statement: ",0xb);
  (*local_530->_vptr_Statement[2])(local_530,poVar3);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar3);
  std::ios_base::~ios_base(local_440);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  p_Var4 = (_Rb_tree_node_base *)(local_268 + 8);
  local_268._8_4_ = _S_red;
  local_258._0_8_ = (_Base_ptr)0x0;
  local_240 = 0.0;
  local_568 = (IVal *)pMVar5;
  local_258._8_8_ = p_Var4;
  local_258._16_8_ = p_Var4;
  (*local_530->_vptr_Statement[4])(local_530,local_268);
  if ((_Rb_tree_node_base *)local_258._8_8_ != p_Var4) {
    p_Var15 = (_Rb_tree_node_base *)local_258._8_8_;
    do {
      (**(code **)(**(long **)(p_Var15 + 1) + 0x30))(*(long **)(p_Var15 + 1),local_1a8);
      p_Var15 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var15);
    } while (p_Var15 != p_Var4);
  }
  if (local_240 != 0.0) {
    local_4b8._0_8_ = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_4b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar3,local_560._M_dataplus._M_p,local_560._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_560._M_dataplus._M_p != &local_560.field_2) {
      operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_440);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_268);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,"precision ",10);
  pcVar16 = glu::getPrecisionName((this->m_ctx).precision);
  if (pcVar16 == (char *)0x0) {
    std::ios::clear((int)(auStack_578 + *(long *)(local_4b8._0_8_ + -0x18)) + 0xc0);
  }
  else {
    sVar17 = strlen(pcVar16);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8,pcVar16,sVar17);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4b8," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_1a8);
  pcVar8 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
  std::ios_base::~ios_base(local_448);
  type.super_ApiType.m_bits = (ApiType)(*((this->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_2e0._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((this->m_extension)._M_string_length != 0) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,
                   "#extension ",&this->m_extension);
    plVar18 = (long *)std::__cxx11::string::append(local_1a8);
    paVar24 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar24) {
      local_4a8._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_4a8._8_8_ = plVar18[3];
      local_4b8._0_8_ = &local_4a8;
    }
    else {
      local_4a8._M_allocated_capacity = paVar24->_M_allocated_capacity;
      local_4b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_4b8._8_8_ = plVar18[1];
    *plVar18 = (long)paVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_2a8,(string *)local_4b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4b8._0_8_ != &local_4a8) {
      operator_delete((void *)local_4b8._0_8_,local_4a8._M_allocated_capacity + 1);
    }
    if ((pointer)local_1a8._0_8_ != pcVar8) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2e0 + 8),1);
  makeSymbol<tcu::Matrix<float,4,2>>
            ((Symbol *)local_4b8,this,
             (local_540->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr);
  uVar11 = local_2e0._8_8_;
  std::__cxx11::string::operator=((string *)local_2e0._8_8_,(string *)local_4b8);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_498);
  glu::VarType::~VarType((VarType *)&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._0_8_ != &local_4a8) {
    operator_delete((void *)local_4b8._0_8_,local_4a8._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_2e0 + 0x20),1);
  makeSymbol<tcu::Matrix<float,2,4>>
            ((Symbol *)local_4b8,this,
             (local_540->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr);
  uVar11 = local_2e0._32_8_;
  std::__cxx11::string::operator=((string *)local_2e0._32_8_,(string *)local_4b8);
  glu::VarType::operator=((VarType *)(uVar11 + 0x20),(VarType *)&local_498);
  glu::VarType::~VarType((VarType *)&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._0_8_ != &local_4a8) {
    operator_delete((void *)local_4b8._0_8_,local_4a8._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4b8);
  (*local_530->_vptr_Statement[2])(local_530,local_4b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4b8);
  std::ios_base::~ios_base(local_448);
  std::__cxx11::string::operator=((string *)&local_288,(string *)local_1a8);
  if ((pointer)local_1a8._0_8_ != pcVar8) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pSVar19 = ShaderExecUtil::createExecutor
                      ((this->m_ctx).renderContext,(this->m_ctx).shaderType,(ShaderSpec *)local_2e0)
  ;
  local_4b8._0_8_ =
       (local_520->in0).
       super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_4b8._8_8_ =
       (local_520->in1).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4a8._M_allocated_capacity =
       (size_type)
       (local_520->in2).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_4a8._8_8_ =
       (local_520->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1a8._0_8_ =
       local_338.out0.
       super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
       _M_impl.super__Vector_impl_data._M_start;
  local_1a8._8_8_ =
       local_338.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar19->_vptr_ShaderExecutor[3])
            (pSVar19,((this->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar14 = (*pSVar19->_vptr_ShaderExecutor[2])(pSVar19);
  if ((char)iVar14 == '\0') {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar19->_vptr_ShaderExecutor[5])(pSVar19);
  pIVar21 = (IVal *)local_1a8;
  (*pSVar19->_vptr_ShaderExecutor[6])(pSVar19,local_538,local_4b8);
  (*pSVar19->_vptr_ShaderExecutor[1])(pSVar19);
  tcu::Matrix<tcu::Interval,_4,_2>::Matrix((Matrix<tcu::Interval,_4,_2> *)local_4b8);
  tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
  pVVar12 = local_540;
  Environment::bind<tcu::Matrix<float,4,2>>
            ((Environment *)&local_4e8,
             (local_540->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
             .m_ptr,(IVal *)local_4b8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_4e8,
             (pVVar12->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)local_268);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_4e8,
             (pVVar12->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_560);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_4e8,
             (pVVar12->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_518);
  Environment::bind<tcu::Matrix<float,2,4>>
            ((Environment *)&local_4e8,
             (pVVar12->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
             .m_ptr,(IVal *)local_1a8);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_4e8,
             (pVVar12->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_569);
  local_528 = this;
  if ((IVal *)pMVar6 == local_568) {
    local_568 = (IVal *)0x0;
  }
  else {
    fmt = &(this->m_ctx).floatFormat;
    local_4f0 = &this->m_status;
    local_4f8 = local_538 + (local_538 == 0);
    uVar28 = 0;
    local_568 = (IVal *)0x0;
    do {
      tcu::Matrix<tcu::Interval,_2,_4>::Matrix((Matrix<tcu::Interval,_2,_4> *)local_1a8);
      if ((uVar28 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_528->super_TestCase).super_TestNode.m_testCtx);
      }
      round<tcu::Matrix<float,4,2>>
                ((IVal *)local_268,(BuiltinPrecisionTests *)fmt,
                 (FloatFormat *)
                 ((local_520->in0).
                  super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar28),(Matrix<float,_4,_2> *)pIVar21
                );
      pVVar12 = local_540;
      ContainerTraits<tcu::Matrix<float,_4,_2>,_tcu::Matrix<tcu::Interval,_4,_2>_>::doConvert
                ((IVal *)local_4b8,fmt,(IVal *)local_268);
      pIVar20 = (Interval *)
                Environment::lookup<tcu::Matrix<float,4,2>>
                          ((Environment *)&local_4e8,
                           (pVVar12->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                           .m_ptr);
      lVar26 = 0;
      pMVar22 = (MessageBuilder *)local_4b8;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)((long)&pIVar20->m_hi + lVar27) =
               *(undefined8 *)(&pMVar22->field_0x10 + lVar27);
          puVar1 = (undefined8 *)((long)&pMVar22->m_log + lVar27);
          dVar10 = (double)puVar1[1];
          pbVar2 = &((Vector<tcu::Vector<tcu::Interval,_4>,_2> *)&pIVar20->m_hasNaN)->m_data[0].
                    m_data[0].m_hasNaN + lVar27;
          *(undefined8 *)pbVar2 = *puVar1;
          *(double *)(pbVar2 + 8) = dVar10;
          lVar27 = lVar27 + 0x60;
        } while (lVar27 == 0x60);
        lVar26 = lVar26 + 1;
        pIVar20 = pIVar20 + 1;
        pMVar22 = (MessageBuilder *)&pMVar22->field_0x18;
      } while (lVar26 != 4);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_4e8,
                 (pVVar12->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_4e8,
                 (pVVar12->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_4e8,
                 (pVVar12->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_490.basic.type = (local_528->m_ctx).precision;
      local_498 = (this->m_ctx).floatFormat.m_maxValue;
      local_4b8._0_8_ = *(undefined8 *)fmt;
      local_4b8._8_8_ = *(undefined8 *)&(this->m_ctx).floatFormat.m_fractionBits;
      local_4a8._M_allocated_capacity = *(undefined8 *)&(this->m_ctx).floatFormat.m_hasInf;
      local_4a8._8_8_ = *(undefined8 *)&(this->m_ctx).floatFormat.m_exactPrecision;
      local_480 = 0;
      local_490._8_8_ = &local_4e8;
      (*local_530->_vptr_Statement[3])(local_530,(MessageBuilder *)local_4b8);
      pIVar21 = Environment::lookup<tcu::Matrix<float,2,4>>
                          ((Environment *)&local_4e8,
                           (pVVar12->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                           .m_ptr);
      ContainerTraits<tcu::Matrix<float,_2,_4>,_tcu::Matrix<tcu::Interval,_2,_4>_>::doConvert
                ((IVal *)local_4b8,&local_308,pIVar21);
      puVar25 = local_1a8;
      poVar3 = (ostringstream *)(local_4b8 + 8);
      pMVar22 = (MessageBuilder *)local_4b8;
      lVar26 = 0;
      do {
        lVar27 = 0;
        do {
          *(undefined8 *)(puVar25 + lVar27 + 0x10) = *(undefined8 *)(&pMVar22->field_0x10 + lVar27);
          puVar1 = (undefined8 *)((long)&pMVar22->m_log + lVar27);
          uVar11 = puVar1[1];
          *(undefined8 *)(puVar25 + lVar27) = *puVar1;
          *(undefined8 *)((long)(puVar25 + lVar27) + 8) = uVar11;
          lVar27 = lVar27 + 0x30;
        } while (lVar27 != 0xc0);
        puVar25 = puVar25 + 0x18;
        pMVar22 = (MessageBuilder *)&pMVar22->field_0x18;
        bVar29 = lVar26 == 0;
        lVar26 = lVar26 + 1;
      } while (bVar29);
      bVar29 = contains<tcu::Matrix<float,2,4>>
                         ((IVal *)local_1a8,
                          local_338.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar28);
      local_4b8._0_8_ = &local_4a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_4b8,"Shader output 0 is outside acceptable range","");
      bVar29 = tcu::ResultCollector::check(local_4f0,bVar29,(string *)local_4b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4b8._0_8_ != &local_4a8) {
        operator_delete((void *)local_4b8._0_8_,(ulong)(local_4a8._M_allocated_capacity + 1));
      }
      uVar23 = (int)local_568 + ((byte)~bVar29 & 1);
      pIVar21 = (IVal *)(ulong)uVar23;
      local_568 = pIVar21;
      if ((int)uVar23 < 0x65 && !bVar29) {
        local_4b8._0_8_ = ((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(poVar3);
        pcVar16 = "Failed";
        if (bVar29) {
          pcVar16 = "Passed";
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,pcVar16,6);
        pVVar12 = local_540;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar7 = (pVVar12->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
                 .m_ptr;
        val = (Matrix<float,_4,_2> *)local_258;
        pcVar8 = (pVVar7->m_name)._M_dataplus._M_p;
        local_268._0_8_ = val;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_268,pcVar8,pcVar8 + (pVVar7->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_268._0_8_,
                   CONCAT44(local_268._12_4_,local_268._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,4,2>>
                  (&local_560,(BuiltinPrecisionTests *)&local_308,
                   (FloatFormat *)
                   ((local_520->in0).
                    super__Vector_base<tcu::Matrix<float,_4,_2>,_std::allocator<tcu::Matrix<float,_4,_2>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar28),val);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_560._M_dataplus._M_p,local_560._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        if ((Matrix<float,_4,_2> *)local_268._0_8_ != (Matrix<float,_4,_2> *)local_258) {
          operator_delete((void *)local_268._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_258._0_8_ + 1));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\t",1);
        pVVar9 = (pVVar12->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_2,_4>_>_>
                 .m_ptr;
        pIVar21 = (IVal *)local_258;
        pcVar8 = (pVVar9->m_name)._M_dataplus._M_p;
        local_268._0_8_ = pIVar21;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_268,pcVar8,pcVar8 + (pVVar9->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,(char *)local_268._0_8_,
                   CONCAT44(local_268._12_4_,local_268._8_4_));
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," = ",3);
        valueToString<tcu::Matrix<float,2,4>>
                  (&local_560,(BuiltinPrecisionTests *)&local_308,
                   (FloatFormat *)
                   (local_338.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar28),
                   (Matrix<float,_2,_4> *)pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_560._M_dataplus._M_p,local_560._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,"\tExpected range: ",0x11);
        intervalToString<tcu::Matrix<float,2,4>>
                  (&local_518,(BuiltinPrecisionTests *)&local_308,(FloatFormat *)local_1a8,pIVar21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar3,local_518._M_dataplus._M_p,local_518._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_518._M_dataplus._M_p != &local_518.field_2) {
          operator_delete(local_518._M_dataplus._M_p,local_518.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_560._M_dataplus._M_p != &local_560.field_2) {
          operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
        }
        if ((IVal *)local_268._0_8_ != (IVal *)local_258) {
          operator_delete((void *)local_268._0_8_,
                          (ulong)((long)(_Rb_tree_color *)local_258._0_8_ + 1));
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar3);
        std::ios_base::~ios_base(local_440);
      }
      uVar28 = uVar28 + 1;
    } while (uVar28 != local_4f8);
  }
  pPVar13 = local_528;
  iVar14 = (int)local_568;
  if (100 < iVar14) {
    local_4b8._0_8_ = ((local_528->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_4b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"(Skipped ",9);
    std::ostream::operator<<(poVar3,iVar14 + -100);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," messages.)",0xb);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar3);
    std::ios_base::~ios_base(local_440);
  }
  if (iVar14 == 0) {
    local_4b8._0_8_ = ((pPVar13->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_4b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs passed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    local_4b8._0_8_ = ((pPVar13->super_TestCase).super_TestNode.m_testCtx)->m_log;
    poVar3 = (ostringstream *)(local_4b8 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar3);
    std::ostream::operator<<(poVar3,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar3," inputs failed.",0xf);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_4b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_4b8 + 8));
  std::ios_base::~ios_base(local_440);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_4e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_p != &local_278) {
    operator_delete(local_288._M_p,
                    CONCAT71(local_278._M_allocated_capacity._1_7_,local_278._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_p != &local_298) {
    operator_delete(local_2a8._M_p,
                    CONCAT71(local_298._M_allocated_capacity._1_7_,local_298._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2e0 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_2e0 + 8));
  if (local_338.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_338.out0.
      super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_338.out0.
                    super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_338.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_338.out0.
                          super__Vector_base<tcu::Matrix<float,_2,_4>,_std::allocator<tcu::Matrix<float,_2,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}